

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O0

bool cmQtAutoGeneratorCommon::RccListInputs
               (string *qtMajorVersion,string *rccCommand,string *fileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *errorMessage)

{
  bool bVar1;
  char *filename;
  ostream *poVar2;
  string local_200 [32];
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ost;
  bool local_31;
  bool allGood;
  string *errorMessage_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *fileName_local;
  string *rccCommand_local;
  string *qtMajorVersion_local;
  
  local_31 = false;
  filename = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    bVar1 = std::operator==(qtMajorVersion,"4");
    if (bVar1) {
      local_31 = RccListInputsQt4(fileName,files,errorMessage);
    }
    else {
      local_31 = RccListInputsQt5(rccCommand,fileName,files,errorMessage);
    }
  }
  else if (errorMessage != (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = std::operator<<((ostream *)local_1b0,"AutoRcc: Error: Rcc file does not exist:\n");
    Quoted(&local_1e0,fileName);
    poVar2 = std::operator<<(poVar2,(string *)&local_1e0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)errorMessage,local_200);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return local_31;
}

Assistant:

bool cmQtAutoGeneratorCommon::RccListInputs(const std::string& qtMajorVersion,
                                            const std::string& rccCommand,
                                            const std::string& fileName,
                                            std::vector<std::string>& files,
                                            std::string* errorMessage)
{
  bool allGood = false;
  if (cmsys::SystemTools::FileExists(fileName.c_str())) {
    if (qtMajorVersion == "4") {
      allGood = RccListInputsQt4(fileName, files, errorMessage);
    } else {
      allGood = RccListInputsQt5(rccCommand, fileName, files, errorMessage);
    }
  } else {
    if (errorMessage != CM_NULLPTR) {
      std::ostringstream ost;
      ost << "AutoRcc: Error: Rcc file does not exist:\n"
          << cmQtAutoGeneratorCommon::Quoted(fileName) << "\n";
      *errorMessage = ost.str();
    }
  }
  return allGood;
}